

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::throwCppExceptionMessage(Forth *this,string *msg,errorCodes ec)

{
  Cell CVar1;
  Cell CVar2;
  AbortException *this_00;
  string local_158;
  string local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  int local_44;
  undefined1 local_40 [4];
  int ecInt;
  string buffer;
  errorCodes ec_local;
  string *msg_local;
  Forth *this_local;
  
  buffer.field_2._12_4_ = ec;
  initClass(this);
  std::__cxx11::string::string((string *)local_40);
  local_44 = buffer.field_2._12_4_;
  CVar1 = getSourceAddress(this);
  CVar2 = getSourceBufferSize(this);
  moveFromDataSpace(this,(string *)local_40,CVar1,(ulong)CVar2);
  this_00 = (AbortException *)__cxa_allocate_exception(0x10);
  std::operator+(&local_118,msg,"\nError code ");
  std::__cxx11::to_string(&local_138,local_44);
  std::operator+(&local_f8,&local_118,&local_138);
  std::operator+(&local_d8,&local_f8,"\n");
  std::operator+(&local_b8,&local_d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
  std::operator+(&local_98,&local_b8,"\n Offset ");
  CVar1 = getSourceBufferOffset(this);
  std::__cxx11::to_string(&local_158,CVar1);
  std::operator+(&local_78,&local_98,&local_158);
  AbortException::AbortException(this_00,&local_78);
  __cxa_throw(this_00,&AbortException::typeinfo,AbortException::~AbortException);
}

Assistant:

void throwCppExceptionMessage(const std::string &msg, enum errorCodes ec){
			initClass();
			std::string buffer{};
			int ecInt=static_cast<int>(ec);
			moveFromDataSpace(buffer, getSourceAddress(), getSourceBufferSize());
			throw AbortException(msg + "\nError code " + std::to_string(ecInt) +"\n" + buffer + "\n Offset " + std::to_string(getSourceBufferOffset()));
		}